

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

void __thiscall Pathie::PathieError::PathieError(PathieError *this)

{
  PathieError *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__PathieError_0011dbc0;
  std::__cxx11::string::string((string *)&this->m_pathie_errmsg);
  std::__cxx11::string::operator=((string *)&this->m_pathie_errmsg,"Unknown pathie exception.");
  return;
}

Assistant:

PathieError::PathieError()
{
  m_pathie_errmsg = "Unknown pathie exception.";
}